

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

void __thiscall
ncnn::ObjectsManager::do_objects_nms
          (ObjectsManager *this,vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *objects,
          float nms,float prob_threh)

{
  pointer pOVar1;
  SafeOrderList<ncnn::ObjectBox> *this_00;
  bool bVar2;
  int start_index;
  ObjectBox *__x;
  int end_index;
  ObjectBoxNmsCondition match;
  ObjectBoxNmsCondition condition;
  ObjectBoxNmsCondition local_40;
  
  pOVar1 = (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
      super__Vector_impl_data._M_finish != pOVar1) {
    (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
    super__Vector_impl_data._M_finish = pOVar1;
  }
  end_index = (int)this->prob_steps;
  start_index = get_prob_index(this,prob_threh);
  while (end_index = end_index + -1, start_index <= end_index) {
    this_00 = (this->object_boxs_table).
              super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_start[end_index];
    while( true ) {
      bVar2 = SafeOrderList<ncnn::ObjectBox>::empty(this_00);
      if (bVar2) break;
      __x = SafeOrderList<ncnn::ObjectBox>::front(this_00);
      std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::push_back(objects,__x);
      SafeOrderList<ncnn::ObjectBox>::pop_front(this_00);
      match.nms_threshold = nms;
      match.top_box = __x;
      match._12_4_ = 0;
      local_40.top_box = __x;
      local_40.nms_threshold = nms;
      SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>(this_00,match);
      do_object_boxs_table_nms(this,&local_40,start_index,end_index);
    }
  }
  return;
}

Assistant:

void ObjectsManager::do_objects_nms(std::vector<ObjectBox> &objects, float nms, float prob_threh)
{
    objects.clear();
    int start = prob_steps - 1;
    int min_index = get_prob_index(prob_threh);
    for (; start >= min_index; start--)
    {
        TObjectBoxs &object_boxs = *object_boxs_table[start];
        if (object_boxs.empty())
        {
            continue;
        }

        do
        {
            ObjectBox &object_box = object_boxs.front();
            objects.push_back(object_box);
            object_boxs.pop_front();

            ObjectBoxNmsCondition condition(object_box, nms);
            object_boxs.remove_all_match(condition);

            do_object_boxs_table_nms(condition, min_index, start);
        } while (!object_boxs.empty());
    }
}